

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O1

int handle_number(void *ctx,char *string,size_t string_length)

{
  byte *pbVar1;
  uchar *number;
  double dVar2;
  int iVar3;
  yajl_val v;
  char *__dest;
  int *piVar4;
  size_t sVar5;
  longlong lVar6;
  char *endptr;
  char *local_38;
  
  v = (yajl_val)malloc(0x28);
  if (v == (yajl_val)0x0) {
    v = (yajl_val)0x0;
  }
  else {
    *(undefined8 *)v = 0;
    (v->u).string = (char *)0x0;
    (v->u).number.d = 0.0;
    (v->u).number.r = (char *)0x0;
    *(undefined8 *)((long)&v->u + 0x18) = 0;
    v->type = yajl_t_number;
  }
  if (v != (yajl_val)0x0) {
    __dest = (char *)malloc(string_length + 1);
    (v->u).number.r = __dest;
    if (__dest != (char *)0x0) {
      memcpy(__dest,string,string_length);
      __dest[string_length] = '\0';
      (v->u).number.flags = 0;
      piVar4 = __errno_location();
      *piVar4 = 0;
      number = (uchar *)(v->u).number.r;
      sVar5 = strlen((char *)number);
      lVar6 = yajl_parse_integer(number,(uint)sVar5);
      (v->u).number.i = lVar6;
      if (*piVar4 == 0) {
        pbVar1 = (byte *)((long)&v->u + 0x18);
        *pbVar1 = *pbVar1 | 1;
      }
      local_38 = (char *)0x0;
      *piVar4 = 0;
      dVar2 = strtod((v->u).number.r,&local_38);
      (v->u).number.d = dVar2;
      if ((local_38 != (char *)0x0 && *piVar4 == 0) && (*local_38 == '\0')) {
        pbVar1 = (byte *)((long)&v->u + 0x18);
        *pbVar1 = *pbVar1 | 2;
      }
      iVar3 = context_add_value((context_t *)ctx,v);
      return (uint)(iVar3 == 0);
    }
    free(v);
  }
  if (*(char **)((long)ctx + 0x10) != (char *)0x0) {
    snprintf(*(char **)((long)ctx + 0x10),*(size_t *)((long)ctx + 0x18),"Out of memory");
  }
  return 0;
}

Assistant:

static int handle_number (void *ctx, const char *string, size_t string_length)
{
    yajl_val v;
    char *endptr;

    v = value_alloc(yajl_t_number);
    if (v == NULL)
        RETURN_ERROR((context_t *) ctx, STATUS_ABORT, "Out of memory");

    v->u.number.r = malloc(string_length + 1);
    if (v->u.number.r == NULL)
    {
        free(v);
        RETURN_ERROR((context_t *) ctx, STATUS_ABORT, "Out of memory");
    }
    memcpy(v->u.number.r, string, string_length);
    v->u.number.r[string_length] = 0;

    v->u.number.flags = 0;

    errno = 0;
    v->u.number.i = yajl_parse_integer((const unsigned char *) v->u.number.r,
                                       strlen(v->u.number.r));
    if (errno == 0)
        v->u.number.flags |= YAJL_NUMBER_INT_VALID;

    endptr = NULL;
    errno = 0;
    v->u.number.d = strtod(v->u.number.r, &endptr);
    if ((errno == 0) && (endptr != NULL) && (*endptr == 0))
        v->u.number.flags |= YAJL_NUMBER_DOUBLE_VALID;

    return ((context_add_value(ctx, v) == 0) ? STATUS_CONTINUE : STATUS_ABORT);
}